

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

char * HTS_strdup(char *string)

{
  char *__dest;
  char *in_RDI;
  char *buff;
  size_t in_stack_fffffffffffffff0;
  
  strlen(in_RDI);
  __dest = (char *)HTS_calloc((size_t)in_RDI,in_stack_fffffffffffffff0);
  strcpy(__dest,in_RDI);
  return __dest;
}

Assistant:

char *HTS_strdup(const char *string)
{
#ifdef FESTIVAL
   return (wstrdup(string));
#else
   char *buff = (char *) HTS_calloc(strlen(string) + 1, sizeof(char));
   strcpy(buff, string);
   return buff;
#endif                          /* FESTIVAL */
}